

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O1

bool __thiscall ProString::operator==(ProString *this,char *other)

{
  char16_t *pcVar1;
  long lVar2;
  undefined1 uVar3;
  CutResult CVar4;
  long lVar5;
  char16_t *pcVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QLatin1String QVar9;
  QStringView QVar10;
  long local_28;
  long local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->m_string).d.ptr;
  local_20 = (long)this->m_offset;
  local_28 = (long)this->m_length;
  CVar4 = QtPrivate::QContainerImplHelper::mid((this->m_string).d.size,&local_20,&local_28);
  lVar8 = 0;
  pcVar6 = (char16_t *)0x0;
  lVar7 = 0;
  if (CVar4 != Null) {
    pcVar6 = pcVar1 + local_20;
    lVar7 = local_28;
  }
  if (other != (char *)0x0) {
    lVar5 = -1;
    do {
      lVar8 = lVar5 + 1;
      lVar2 = lVar5 + 1;
      lVar5 = lVar8;
    } while (other[lVar2] != '\0');
  }
  if (lVar8 == lVar7) {
    QVar9.m_data = other;
    QVar9.m_size = lVar8;
    QVar10.m_data = pcVar6;
    QVar10.m_size = lVar7;
    uVar3 = QtPrivate::equalStrings(QVar9,QVar10);
  }
  else {
    uVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(const char *other) const { return toQStringView() == QLatin1String(other); }